

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O1

void __thiscall
Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Expected(Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  pointer pcVar3;
  pointer *ppVVar4;
  pointer pVVar5;
  
  if (this->has_value_ != true) {
    pVVar5 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVVar4 = &(this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pVVar5 != (pointer)ppVVar4) {
      operator_delete(pVVar5,(ulong)((long)&(*ppVVar4)->type_ + 1));
      return;
    }
    return;
  }
  pVVar2 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar5 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar5 != pVVar2; pVVar5 = pVVar5 + 1) {
    std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&pVVar5->sequence_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                 *)&pVVar5->mapping_);
    pcVar3 = (pVVar5->string_)._M_dataplus._M_p;
    paVar1 = &(pVVar5->string_).field_2;
    if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  pVVar5 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5,(long)(this->field_0).value_.
                                 super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar5);
    return;
  }
  return;
}

Assistant:

~Expected() {
		if (has_value_)
			value_.~T();
		else
			error_.~UnexpectedType();
	}